

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_difference_iterator.hpp
# Opt level: O1

bool __thiscall
burst::
symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>
::equal(symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>
        *this,symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>
              *that)

{
  integer_range<int> *piVar1;
  integer_range<int> *piVar2;
  int iVar3;
  integer_range<int> *piVar4;
  integer_range<int> *piVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  
  piVar5 = (this->m_begin)._M_current;
  piVar4 = (that->m_begin)._M_current;
  if (piVar5 != piVar4) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/symmetric_difference_iterator.hpp"
                  ,0xc4,
                  "bool burst::symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int> *, std::vector<boost::integer_range<int>>>>::equal(const symmetric_difference_iterator<RandomAccessIterator, Compare> &) const [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::integer_range<int> *, std::vector<boost::integer_range<int>>>, Compare = std::less<void>]"
                 );
  }
  piVar1 = (this->m_end)._M_current;
  if ((long)piVar1 - (long)piVar5 != (long)(that->m_end)._M_current - (long)piVar4) {
    return false;
  }
  bVar8 = piVar5 == piVar1;
  if (!bVar8) {
    iVar7 = (piVar5->super_iterator_range<boost::range_detail::integer_iterator<int>_>).
            super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
            .
            super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
            .
            super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
            .m_Begin.m_value;
    iVar6 = (piVar5->super_iterator_range<boost::range_detail::integer_iterator<int>_>).
            super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
            .
            super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
            .
            super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
            .m_End.m_value;
    iVar3 = (piVar4->super_iterator_range<boost::range_detail::integer_iterator<int>_>).
            super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
            .
            super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
            .
            super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
            .m_Begin.m_value;
    if (iVar3 - (piVar4->super_iterator_range<boost::range_detail::integer_iterator<int>_>).
                super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
                .
                super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                .
                super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                .m_End.m_value == iVar7 - iVar6) {
      do {
        bVar9 = iVar7 != iVar6;
        if (iVar7 == iVar3 && bVar9) {
          do {
            bVar10 = iVar6 + -1 == iVar7;
            bVar9 = !bVar10;
            if (bVar10) break;
            bVar10 = iVar7 == iVar3;
            iVar7 = iVar7 + 1;
            iVar3 = iVar3 + 1;
          } while (bVar10);
        }
        if (bVar9) {
          return bVar8;
        }
        bVar8 = piVar5 + 1 == piVar1;
        if (bVar8) {
          return bVar8;
        }
        iVar3 = piVar4[1].super_iterator_range<boost::range_detail::integer_iterator<int>_>.
                super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
                .
                super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                .
                super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                .m_Begin.m_value;
        piVar2 = piVar4 + 1;
        piVar4 = piVar4 + 1;
        iVar7 = piVar5[1].super_iterator_range<boost::range_detail::integer_iterator<int>_>.
                super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
                .
                super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                .
                super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                .m_Begin.m_value;
        iVar6 = piVar5[1].super_iterator_range<boost::range_detail::integer_iterator<int>_>.
                super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
                .
                super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                .
                super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                .m_End.m_value;
        piVar5 = piVar5 + 1;
      } while (iVar3 - (piVar2->super_iterator_range<boost::range_detail::integer_iterator<int>_>).
                       super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
                       .
                       super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                       .
                       super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                       .m_End.m_value == iVar7 - iVar6);
    }
  }
  return bVar8;
}

Assistant:

bool equal (const symmetric_difference_iterator & that) const
        {
            assert(this->m_begin == that.m_begin);
            return std::equal(this->m_begin, this->m_end, that.m_begin, that.m_end);
        }